

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O3

void iterator_offset_access_test(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  fdb_kvs_handle *pfVar3;
  size_t sVar4;
  uint uVar5;
  long lVar6;
  fdb_iterator **ptr_iterator;
  fdb_config *pfVar7;
  int iVar8;
  fdb_doc **unaff_RBP;
  fdb_doc *doc;
  char *pcVar9;
  fdb_kvs_handle *unaff_R12;
  ulong uVar10;
  char *unaff_R14;
  char *unaff_R15;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_iterator *it;
  fdb_doc *rdoc;
  fdb_kvs_handle *o_db;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char keybuf [256];
  char bodybuf [256];
  fdb_config fconfig;
  fdb_iterator *pfStack_2f00;
  fdb_kvs_handle *pfStack_2ef8;
  fdb_file_handle *pfStack_2ef0;
  fdb_doc *pfStack_2ee8;
  fdb_kvs_config fStack_2ee0;
  timeval tStack_2ec8;
  fdb_config fStack_2eb8;
  fdb_config *pfStack_2dc0;
  fdb_iterator *pfStack_2da8;
  fdb_kvs_handle *pfStack_2da0;
  fdb_doc *pfStack_2d98;
  fdb_file_handle *pfStack_2d90;
  fdb_kvs_config fStack_2d88;
  timeval tStack_2d70;
  fdb_config fStack_2d60;
  fdb_config *pfStack_2c68;
  fdb_iterator *pfStack_2c50;
  fdb_kvs_handle *pfStack_2c48;
  fdb_file_handle *pfStack_2c40;
  fdb_doc *pfStack_2c38;
  uint64_t uStack_2c30;
  undefined1 uStack_2c28;
  undefined7 uStack_2c20;
  undefined4 uStack_2c19;
  undefined8 uStack_2c10;
  undefined7 uStack_2c08;
  undefined4 uStack_2c01;
  fdb_kvs_config fStack_2bf8;
  timeval tStack_2be0;
  undefined4 uStack_2bd0;
  undefined1 uStack_2bcc;
  fdb_config fStack_2ac8;
  char acStack_29d0 [256];
  fdb_config *pfStack_28d0;
  fdb_iterator **ppfStack_28c8;
  code *pcStack_28c0;
  fdb_doc *pfStack_28a8;
  fdb_iterator *pfStack_28a0;
  fdb_kvs_handle *pfStack_2898;
  fdb_file_handle *pfStack_2890;
  fdb_kvs_config fStack_2888;
  timeval tStack_2870;
  fdb_config fStack_2860;
  fdb_iterator **ppfStack_2768;
  fdb_iterator *pfStack_2750;
  fdb_doc *pfStack_2748;
  fdb_kvs_handle *pfStack_2740;
  fdb_file_handle *pfStack_2738;
  timeval tStack_2730;
  undefined2 uStack_2720;
  undefined6 uStack_271e;
  fdb_kvs_config fStack_2618;
  char acStack_2600 [264];
  fdb_config fStack_24f8;
  char acStack_2400 [256];
  fdb_kvs_handle *pfStack_2300;
  fdb_kvs_handle *pfStack_22f8;
  fdb_doc **ppfStack_22f0;
  fdb_doc **ppfStack_22e8;
  fdb_doc **ppfStack_22e0;
  fdb_kvs_handle *local_22d0;
  fdb_file_handle *local_22c8;
  fdb_iterator *local_22c0;
  fdb_doc *local_22b8;
  fdb_kvs_handle *local_22b0;
  fdb_doc *local_22a8;
  fdb_kvs_config local_22a0;
  timeval local_2288;
  fdb_doc *local_2278 [32];
  undefined1 local_2178 [272];
  uint8_t local_2068 [20];
  undefined4 local_2054;
  undefined4 local_204c;
  undefined1 local_2042;
  fdb_doc *apfStack_1f78 [500];
  fdb_kvs_handle local_fd8 [7];
  
  ppfStack_22e0 = (fdb_doc **)0x11b659;
  gettimeofday(&local_2288,(__timezone_ptr_t)0x0);
  ppfStack_22e0 = (fdb_doc **)0x11b65e;
  memleak_start();
  local_22b8 = (fdb_doc *)0x0;
  ppfStack_22e0 = (fdb_doc **)0x11b673;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar3 = (fdb_kvs_handle *)(local_2178 + 0x108);
  ppfStack_22e0 = (fdb_doc **)0x11b683;
  fdb_get_default_config();
  ppfStack_22e0 = (fdb_doc **)0x11b68d;
  fdb_get_default_kvs_config();
  local_2068[8] = '\0';
  local_2068[9] = '\x02';
  local_2068[10] = '\0';
  local_2068[0xb] = '\0';
  local_2068[0xc] = '\0';
  local_2068[0xd] = '\0';
  local_2068[0xe] = '\0';
  local_2068[0xf] = '\0';
  local_2068[0] = '\0';
  local_2068[1] = '\x10';
  local_2068[2] = '\0';
  local_2068[3] = '\0';
  local_2068[4] = '\0';
  local_2068[5] = '\0';
  local_2068[6] = '\0';
  local_2068[7] = '\0';
  local_204c = 1;
  local_2042 = 0;
  local_2054 = 1;
  ppfStack_22e0 = (fdb_doc **)0x11b6c0;
  fVar2 = fdb_open(&local_22c8,"./iterator_test1",(fdb_config *)pfVar3);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb79;
  ppfStack_22e0 = (fdb_doc **)0x11b6e3;
  fVar2 = fdb_kvs_open(local_22c8,&local_22d0,"DB",&local_22a0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb7e;
  ppfStack_22e0 = (fdb_doc **)0x11b706;
  fVar2 = fdb_kvs_open(local_22c8,&local_22b0,"ODB",&local_22a0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb83;
  unaff_R14 = (char *)local_2278;
  unaff_R12 = (fdb_kvs_handle *)local_2178;
  unaff_R15 = (char *)0x0;
  uVar10 = 0;
  do {
    ppfStack_22e0 = (fdb_doc **)0x11b735;
    sprintf(unaff_R14,"key%d",uVar10 & 0xffffffff);
    ppfStack_22e0 = (fdb_doc **)0x11b749;
    sprintf((char *)unaff_R12,"body%d",uVar10 & 0xffffffff);
    unaff_RBP = (fdb_doc **)((long)apfStack_1f78 + (long)unaff_R15);
    ppfStack_22e0 = (fdb_doc **)0x11b75c;
    pfVar3 = (fdb_kvs_handle *)strlen(unaff_R14);
    ppfStack_22e0 = (fdb_doc **)0x11b767;
    sVar4 = strlen((char *)unaff_R12);
    ppfStack_22e0 = (fdb_doc **)0x11b781;
    fdb_doc_create(unaff_RBP,unaff_R14,(size_t)pfVar3,(void *)0x0,0,unaff_R12,sVar4);
    ppfStack_22e0 = (fdb_doc **)0x11b793;
    fVar2 = fdb_set(local_22d0,apfStack_1f78[uVar10]);
    pfVar1 = local_22b0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011bb4c:
      ppfStack_22e0 = (fdb_doc **)0x11bb51;
      iterator_offset_access_test();
      goto LAB_0011bb51;
    }
    ppfStack_22e0 = (fdb_doc **)0x11b7a8;
    sVar4 = strlen(unaff_R14);
    ppfStack_22e0 = (fdb_doc **)0x11b7c8;
    fVar2 = fdb_set_kv(pfVar1,unaff_R14,sVar4,&apfStack_1f78[uVar10]->offset,8);
    pfVar3 = pfVar1;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      ppfStack_22e0 = (fdb_doc **)0x11bb4c;
      iterator_offset_access_test();
      goto LAB_0011bb4c;
    }
    uVar10 = uVar10 + 1;
    unaff_R15 = (char *)((long)unaff_R15 + 8);
  } while (uVar10 != 1000);
  ppfStack_22e0 = (fdb_doc **)0x11b7f3;
  fVar2 = fdb_commit(local_22c8,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb88;
  pfVar3 = (fdb_kvs_handle *)0xfa;
  unaff_R14 = "key%d";
  unaff_R15 = (char *)local_2278;
  do {
    ppfStack_22e0 = (fdb_doc **)0x11b81b;
    sprintf(unaff_R15,"key%d",pfVar3);
    unaff_R12 = local_22d0;
    ppfStack_22e0 = (fdb_doc **)0x11b828;
    sVar4 = strlen(unaff_R15);
    ppfStack_22e0 = (fdb_doc **)0x11b836;
    fVar2 = fdb_del_kv(unaff_R12,unaff_R15,sVar4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb51;
    uVar5 = (int)pfVar3 + 1;
    pfVar3 = (fdb_kvs_handle *)(ulong)uVar5;
  } while (uVar5 != 500);
  unaff_R14 = (char *)local_2278;
  unaff_R12 = (fdb_kvs_handle *)local_2178;
  unaff_R15 = (char *)0x0;
  uVar10 = 0;
  do {
    ppfStack_22e0 = (fdb_doc **)0x11b86f;
    sprintf(unaff_R14,"k0y%d",uVar10 & 0xffffffff);
    ppfStack_22e0 = (fdb_doc **)0x11b883;
    sprintf((char *)unaff_R12,"b0dy%d",uVar10 & 0xffffffff);
    unaff_RBP = (fdb_doc **)((long)apfStack_1f78 + (long)unaff_R15);
    ppfStack_22e0 = (fdb_doc **)0x11b89b;
    fdb_doc_free(apfStack_1f78[uVar10]);
    ppfStack_22e0 = (fdb_doc **)0x11b8a3;
    pfVar3 = (fdb_kvs_handle *)strlen(unaff_R14);
    ppfStack_22e0 = (fdb_doc **)0x11b8ae;
    sVar4 = strlen((char *)unaff_R12);
    ppfStack_22e0 = (fdb_doc **)0x11b8c8;
    fdb_doc_create(unaff_RBP,unaff_R14,(size_t)pfVar3,(void *)0x0,0,unaff_R12,sVar4);
    ppfStack_22e0 = (fdb_doc **)0x11b8da;
    fVar2 = fdb_set(local_22d0,apfStack_1f78[uVar10]);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb56;
    uVar10 = uVar10 + 1;
    unaff_R15 = (char *)((long)unaff_R15 + 8);
  } while (uVar10 != 0xfa);
  ppfStack_22e0 = (fdb_doc **)0x11b902;
  fVar2 = fdb_commit(local_22c8,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb8d;
  ppfStack_22e0 = (fdb_doc **)0x11b92a;
  fdb_iterator_init(local_22b0,&local_22c0,(void *)0x0,0,(void *)0x0,0,2);
  unaff_R12 = (fdb_kvs_handle *)0x1ea;
  pfVar3 = local_fd8;
  unaff_R14 = (char *)&local_22b8;
  unaff_R15 = (char *)&local_22a8;
  do {
    ppfStack_22e0 = (fdb_doc **)0x11b94f;
    fVar2 = fdb_get_byoffset(local_22d0,*(fdb_doc **)&pfVar3->kvs_config);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb60;
    ppfStack_22e0 = (fdb_doc **)0x11b96d;
    fVar2 = fdb_iterator_seek(local_22c0,(void *)(*(size_t **)&pfVar3->kvs_config)[4],
                              **(size_t **)&pfVar3->kvs_config,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb5b;
    ppfStack_22e0 = (fdb_doc **)0x11b982;
    fVar2 = fdb_iterator_get(local_22c0,(fdb_doc **)unaff_R14);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb6a;
    doc = *(fdb_doc **)&pfVar3->kvs_config;
    if (*local_22b8->body != (*(fdb_doc **)&pfVar3->kvs_config)->offset) {
      ppfStack_22e0 = (fdb_doc **)0x11b9e3;
      iterator_offset_access_test();
      doc = local_22a8;
    }
    ppfStack_22e0 = (fdb_doc **)0x11b9a9;
    fVar2 = fdb_del(local_22d0,doc);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb65;
    ppfStack_22e0 = (fdb_doc **)0x11b9be;
    fdb_get_metaonly(local_22d0,*(fdb_doc **)&pfVar3->kvs_config);
    unaff_R12 = (fdb_kvs_handle *)((long)&(unaff_R12->kvs_config).custom_cmp + 2);
    pfVar3 = (fdb_kvs_handle *)&pfVar3->dhandle;
  } while (unaff_R12 < (fdb_kvs_handle *)0x3de);
  ppfStack_22e0 = (fdb_doc **)0x11b9f4;
  fdb_iterator_close(local_22c0);
  ppfStack_22e0 = (fdb_doc **)0x11ba03;
  fVar2 = fdb_commit(local_22c8,'\x01');
  if (fVar2 == FDB_RESULT_SUCCESS) {
    unaff_R14 = (char *)local_2278;
    unaff_R15 = "b1dy%d";
    unaff_R12 = (fdb_kvs_handle *)local_2178;
    unaff_RBP = (fdb_doc **)0x0;
    do {
      ppfStack_22e0 = (fdb_doc **)0x11ba34;
      sprintf(unaff_R14,"k1y%d",unaff_RBP);
      ppfStack_22e0 = (fdb_doc **)0x11ba43;
      sprintf((char *)unaff_R12,"b1dy%d",unaff_RBP);
      pfVar1 = local_22d0;
      ppfStack_22e0 = (fdb_doc **)0x11ba50;
      pfVar3 = (fdb_kvs_handle *)strlen(unaff_R14);
      ppfStack_22e0 = (fdb_doc **)0x11ba5b;
      sVar4 = strlen((char *)unaff_R12);
      ppfStack_22e0 = (fdb_doc **)0x11ba6f;
      fVar2 = fdb_set_kv(pfVar1,unaff_R14,(size_t)pfVar3,unaff_R12,sVar4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb6f;
      uVar5 = (int)unaff_RBP + 1;
      unaff_RBP = (fdb_doc **)(ulong)uVar5;
    } while (uVar5 != 0xfa);
    unaff_R14 = (char *)0x1ea;
    pfVar3 = local_fd8;
    while( true ) {
      ppfStack_22e0 = (fdb_doc **)0x11ba9c;
      fVar2 = fdb_get_byoffset(local_22d0,*(fdb_doc **)&pfVar3->kvs_config);
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) break;
      if (*(char *)(*(long *)&pfVar3->kvs_config + 0x48) == '\0') {
        ppfStack_22e0 = (fdb_doc **)0x11bac9;
        iterator_offset_access_test();
      }
      unaff_R14 = (char *)((long)unaff_R14 + 10);
      pfVar3 = (fdb_kvs_handle *)&pfVar3->dhandle;
      if ((fdb_doc **)0x3dd < unaff_R14) {
        lVar6 = 0;
        do {
          ppfStack_22e0 = (fdb_doc **)0x11bada;
          fdb_doc_free(apfStack_1f78[lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 1000);
        ppfStack_22e0 = (fdb_doc **)0x11baf0;
        fdb_doc_free(local_22b8);
        ppfStack_22e0 = (fdb_doc **)0x11bafa;
        fdb_close(local_22c8);
        ppfStack_22e0 = (fdb_doc **)0x11baff;
        fdb_shutdown();
        ppfStack_22e0 = (fdb_doc **)0x11bb04;
        memleak_end();
        pcVar9 = "%s PASSED\n";
        if (iterator_offset_access_test()::__test_pass != '\0') {
          pcVar9 = "%s FAILED\n";
        }
        ppfStack_22e0 = (fdb_doc **)0x11bb35;
        fprintf(_stderr,pcVar9,"iterator offset access test");
        return;
      }
    }
    goto LAB_0011bb74;
  }
  goto LAB_0011bb92;
LAB_0011bb51:
  ppfStack_22e0 = (fdb_doc **)0x11bb56;
  iterator_offset_access_test();
LAB_0011bb56:
  ppfStack_22e0 = (fdb_doc **)0x11bb5b;
  iterator_offset_access_test();
LAB_0011bb5b:
  ppfStack_22e0 = (fdb_doc **)0x11bb60;
  iterator_offset_access_test();
LAB_0011bb60:
  ppfStack_22e0 = (fdb_doc **)0x11bb65;
  iterator_offset_access_test();
LAB_0011bb65:
  ppfStack_22e0 = (fdb_doc **)0x11bb6a;
  iterator_offset_access_test();
LAB_0011bb6a:
  ppfStack_22e0 = (fdb_doc **)0x11bb6f;
  iterator_offset_access_test();
LAB_0011bb6f:
  ppfStack_22e0 = (fdb_doc **)0x11bb74;
  iterator_offset_access_test();
LAB_0011bb74:
  ppfStack_22e0 = (fdb_doc **)0x11bb79;
  iterator_offset_access_test();
LAB_0011bb79:
  ppfStack_22e0 = (fdb_doc **)0x11bb7e;
  iterator_offset_access_test();
LAB_0011bb7e:
  ppfStack_22e0 = (fdb_doc **)0x11bb83;
  iterator_offset_access_test();
LAB_0011bb83:
  ppfStack_22e0 = (fdb_doc **)0x11bb88;
  iterator_offset_access_test();
LAB_0011bb88:
  ppfStack_22e0 = (fdb_doc **)0x11bb8d;
  iterator_offset_access_test();
LAB_0011bb8d:
  ppfStack_22e0 = (fdb_doc **)0x11bb92;
  iterator_offset_access_test();
LAB_0011bb92:
  ppfStack_22e0 = (fdb_doc **)iterator_deleted_doc_right_before_the_end_test;
  iterator_offset_access_test();
  ppfStack_2768 = (fdb_iterator **)0x11bbb2;
  pfStack_2300 = pfVar3;
  pfStack_22f8 = unaff_R12;
  ppfStack_22f0 = (fdb_doc **)unaff_R14;
  ppfStack_22e8 = (fdb_doc **)unaff_R15;
  ppfStack_22e0 = unaff_RBP;
  gettimeofday(&tStack_2730,(__timezone_ptr_t)0x0);
  ppfStack_2768 = (fdb_iterator **)0x11bbb7;
  memleak_start();
  ppfStack_2768 = (fdb_iterator **)0x11bbc7;
  fdb_get_default_config();
  fStack_24f8.buffercache_size = 0;
  ppfStack_2768 = (fdb_iterator **)0x11bbdf;
  fdb_get_default_kvs_config();
  ppfStack_2768 = (fdb_iterator **)0x11bc02;
  sprintf(acStack_2600,"rm -rf  %s*","./dummy");
  ppfStack_2768 = (fdb_iterator **)0x11bc0a;
  system(acStack_2600);
  ppfStack_2768 = (fdb_iterator **)0x11bc1d;
  fdb_open(&pfStack_2738,"./dummy",&fStack_24f8);
  ppfStack_2768 = (fdb_iterator **)0x11bc30;
  fdb_kvs_open(pfStack_2738,&pfStack_2740,(char *)0x0,&fStack_2618);
  uVar10 = 0;
  do {
    ppfStack_2768 = (fdb_iterator **)0x11bc5c;
    sprintf((char *)&uStack_2720,"k%06d\n",uVar10);
    ppfStack_2768 = (fdb_iterator **)0x11bc6b;
    sprintf(acStack_2400,"v%06d\n",uVar10);
    ppfStack_2768 = (fdb_iterator **)0x11bc86;
    fdb_set_kv(pfStack_2740,&uStack_2720,8,acStack_2400,8);
    uVar5 = (int)uVar10 + 1;
    uVar10 = (ulong)uVar5;
  } while (uVar5 != 3);
  ppfStack_2768 = (fdb_iterator **)0x11bca8;
  sprintf((char *)&uStack_2720,"k%06d\n",1);
  ppfStack_2768 = (fdb_iterator **)0x11bcba;
  fdb_del_kv(pfStack_2740,&uStack_2720,8);
  ppfStack_2768 = (fdb_iterator **)0x11bcc6;
  fdb_commit(pfStack_2738,'\0');
  uStack_2720 = 0x61;
  acStack_2600[0] = 'z';
  acStack_2600[1] = '\0';
  ppfStack_2768 = (fdb_iterator **)0x11bcfd;
  fVar2 = fdb_iterator_init(pfStack_2740,&pfStack_2750,&uStack_2720,1,acStack_2600,1,2);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    ppfStack_2768 = (fdb_iterator **)0x11bd0f;
    fVar2 = fdb_iterator_seek_to_max(pfStack_2750);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf38;
    pfStack_2748 = (fdb_doc *)0x0;
    ppfStack_2768 = (fdb_iterator **)0x11bd2d;
    fVar2 = fdb_iterator_get(pfStack_2750,&pfStack_2748);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf3d;
    ppfStack_2768 = (fdb_iterator **)0x11bd50;
    sprintf((char *)&uStack_2720,"k%06d\n",2);
    if (*pfStack_2748->key != CONCAT62(uStack_271e,uStack_2720)) goto LAB_0011bf42;
    ppfStack_2768 = (fdb_iterator **)0x11bd6a;
    fdb_doc_free(pfStack_2748);
    ppfStack_2768 = (fdb_iterator **)0x11bd74;
    fVar2 = fdb_iterator_prev(pfStack_2750);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf4c;
    pfStack_2748 = (fdb_doc *)0x0;
    ppfStack_2768 = (fdb_iterator **)0x11bd92;
    fVar2 = fdb_iterator_get(pfStack_2750,&pfStack_2748);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf51;
    ppfStack_2768 = (fdb_iterator **)0x11bdb2;
    sprintf((char *)&uStack_2720,"k%06d\n",0);
    if (*pfStack_2748->key != CONCAT62(uStack_271e,uStack_2720)) goto LAB_0011bf56;
    ppfStack_2768 = (fdb_iterator **)0x11bdcc;
    fdb_doc_free(pfStack_2748);
    ptr_iterator = &pfStack_2750;
    ppfStack_2768 = (fdb_iterator **)0x11bdd9;
    fdb_iterator_close(pfStack_2750);
    ppfStack_2768 = (fdb_iterator **)0x11be05;
    fVar2 = fdb_iterator_init(pfStack_2740,ptr_iterator,&uStack_2720,1,acStack_2600,1,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf60;
    ppfStack_2768 = (fdb_iterator **)0x11be17;
    fVar2 = fdb_iterator_seek_to_min(pfStack_2750);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf65;
    pfStack_2748 = (fdb_doc *)0x0;
    ppfStack_2768 = (fdb_iterator **)0x11be35;
    fVar2 = fdb_iterator_get(pfStack_2750,&pfStack_2748);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf6a;
    ptr_iterator = (fdb_iterator **)&uStack_2720;
    ppfStack_2768 = (fdb_iterator **)0x11be55;
    sprintf((char *)ptr_iterator,"k%06d\n",0);
    if (*pfStack_2748->key != CONCAT62(uStack_271e,uStack_2720)) goto LAB_0011bf6f;
    ppfStack_2768 = (fdb_iterator **)0x11be6f;
    fdb_doc_free(pfStack_2748);
    ppfStack_2768 = (fdb_iterator **)0x11be79;
    fVar2 = fdb_iterator_next(pfStack_2750);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf79;
    pfStack_2748 = (fdb_doc *)0x0;
    ppfStack_2768 = (fdb_iterator **)0x11be97;
    fVar2 = fdb_iterator_get(pfStack_2750,&pfStack_2748);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf7e;
    ptr_iterator = (fdb_iterator **)&uStack_2720;
    ppfStack_2768 = (fdb_iterator **)0x11beba;
    sprintf((char *)ptr_iterator,"k%06d\n",2);
    if (*pfStack_2748->key == CONCAT62(uStack_271e,uStack_2720)) {
      ppfStack_2768 = (fdb_iterator **)0x11bed4;
      fdb_doc_free(pfStack_2748);
      ppfStack_2768 = (fdb_iterator **)0x11bede;
      fdb_iterator_close(pfStack_2750);
      ppfStack_2768 = (fdb_iterator **)0x11bee8;
      fdb_close(pfStack_2738);
      ppfStack_2768 = (fdb_iterator **)0x11beed;
      fdb_shutdown();
      ppfStack_2768 = (fdb_iterator **)0x11bef2;
      memleak_end();
      pcVar9 = "%s PASSED\n";
      if (iterator_deleted_doc_right_before_the_end_test()::__test_pass != '\0') {
        pcVar9 = "%s FAILED\n";
      }
      ppfStack_2768 = (fdb_iterator **)0x11bf23;
      fprintf(_stderr,pcVar9,"iterator deleted doc right before the end of iteration test");
      return;
    }
  }
  else {
    ppfStack_2768 = (fdb_iterator **)0x11bf38;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf38:
    ppfStack_2768 = (fdb_iterator **)0x11bf3d;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf3d:
    ppfStack_2768 = (fdb_iterator **)0x11bf42;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf42:
    ppfStack_2768 = (fdb_iterator **)0x11bf4c;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf4c:
    ppfStack_2768 = (fdb_iterator **)0x11bf51;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf51:
    ppfStack_2768 = (fdb_iterator **)0x11bf56;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf56:
    ptr_iterator = (fdb_iterator **)&uStack_2720;
    ppfStack_2768 = (fdb_iterator **)0x11bf60;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf60:
    ppfStack_2768 = (fdb_iterator **)0x11bf65;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf65:
    ppfStack_2768 = (fdb_iterator **)0x11bf6a;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf6a:
    ppfStack_2768 = (fdb_iterator **)0x11bf6f;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf6f:
    ppfStack_2768 = (fdb_iterator **)0x11bf79;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf79:
    ppfStack_2768 = (fdb_iterator **)0x11bf7e;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf7e:
    ppfStack_2768 = (fdb_iterator **)0x11bf83;
    iterator_deleted_doc_right_before_the_end_test();
  }
  ppfStack_2768 = (fdb_iterator **)iterator_uncommited_seeks;
  iterator_deleted_doc_right_before_the_end_test();
  pcStack_28c0 = (code *)0x11bfa1;
  ppfStack_2768 = ptr_iterator;
  gettimeofday(&tStack_2870,(__timezone_ptr_t)0x0);
  pfStack_28a8 = (fdb_doc *)0x0;
  pcStack_28c0 = (code *)0x11bfaf;
  memleak_start();
  pfVar7 = &fStack_2860;
  pcStack_28c0 = (code *)0x11bfbc;
  fdb_get_default_config();
  pcStack_28c0 = (code *)0x11bfc6;
  fdb_get_default_kvs_config();
  pcStack_28c0 = (code *)0x11bfd2;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcStack_28c0 = (code *)0x11bfe6;
  fVar2 = fdb_open(&pfStack_2890,"./iterator_test1",pfVar7);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_28c0 = (code *)0x11c002;
    fVar2 = fdb_kvs_open_default(pfStack_2890,&pfStack_2898,&fStack_2888);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c20d;
    pcStack_28c0 = (code *)0x11c025;
    fdb_set_kv(pfStack_2898,"a",1,(void *)0x0,0);
    pfVar7 = (fdb_config *)0x154b95;
    pcStack_28c0 = (code *)0x11c043;
    fdb_set_kv(pfStack_2898,"b",1,(void *)0x0,0);
    pcStack_28c0 = (code *)0x11c05e;
    fdb_set_kv(pfStack_2898,"c",1,(void *)0x0,0);
    pcStack_28c0 = (code *)0x11c082;
    fVar2 = fdb_iterator_init(pfStack_2898,&pfStack_28a0,"b",1,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c214;
    pcStack_28c0 = (code *)0x11c094;
    fVar2 = fdb_iterator_seek_to_min(pfStack_28a0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c219;
    pcStack_28c0 = (code *)0x11c0ab;
    fVar2 = fdb_iterator_get(pfStack_28a0,&pfStack_28a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c220;
    if (*pfStack_28a8->key != 'b') goto LAB_0011c227;
    pcStack_28c0 = (code *)0x11c0ca;
    fdb_doc_free(pfStack_28a8);
    pfStack_28a8 = (fdb_doc *)0x0;
    pcStack_28c0 = (code *)0x11c0dd;
    fVar2 = fdb_iterator_seek_to_max(pfStack_28a0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c22f;
    pcStack_28c0 = (code *)0x11c0f4;
    fVar2 = fdb_iterator_get(pfStack_28a0,&pfStack_28a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c236;
    if (*pfStack_28a8->key != 'c') goto LAB_0011c23d;
    pcStack_28c0 = (code *)0x11c113;
    fdb_doc_free(pfStack_28a8);
    pfStack_28a8 = (fdb_doc *)0x0;
    pcStack_28c0 = (code *)0x11c126;
    fVar2 = fdb_iterator_prev(pfStack_28a0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c245;
    pcStack_28c0 = (code *)0x11c13d;
    fVar2 = fdb_iterator_get(pfStack_28a0,&pfStack_28a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c24c;
    if (*pfStack_28a8->key != 'b') goto LAB_0011c253;
    pcStack_28c0 = (code *)0x11c15c;
    fdb_doc_free(pfStack_28a8);
    pfStack_28a8 = (fdb_doc *)0x0;
    pcStack_28c0 = (code *)0x11c16f;
    fVar2 = fdb_iterator_next(pfStack_28a0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c25b;
    pcStack_28c0 = (code *)0x11c186;
    fVar2 = fdb_iterator_get(pfStack_28a0,&pfStack_28a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c262;
    if (*pfStack_28a8->key == 'c') {
      pcStack_28c0 = (code *)0x11c1a5;
      fdb_doc_free(pfStack_28a8);
      pfStack_28a8 = (fdb_doc *)0x0;
      pcStack_28c0 = (code *)0x11c1b8;
      fdb_iterator_close(pfStack_28a0);
      pcStack_28c0 = (code *)0x11c1c2;
      fdb_close(pfStack_2890);
      pcStack_28c0 = (code *)0x11c1c7;
      fdb_shutdown();
      pcStack_28c0 = (code *)0x11c1cc;
      memleak_end();
      pcVar9 = "%s PASSED\n";
      if (iterator_uncommited_seeks()::__test_pass != '\0') {
        pcVar9 = "%s FAILED\n";
      }
      pcStack_28c0 = (code *)0x11c1fd;
      fprintf(_stderr,pcVar9,"iterator single doc range");
      return;
    }
  }
  else {
    pcStack_28c0 = (code *)0x11c20d;
    iterator_uncommited_seeks();
LAB_0011c20d:
    pcStack_28c0 = (code *)0x11c214;
    iterator_uncommited_seeks();
LAB_0011c214:
    pcStack_28c0 = (code *)0x11c219;
    iterator_uncommited_seeks();
LAB_0011c219:
    pcStack_28c0 = (code *)0x11c220;
    iterator_uncommited_seeks();
LAB_0011c220:
    pcStack_28c0 = (code *)0x11c227;
    iterator_uncommited_seeks();
LAB_0011c227:
    pcStack_28c0 = (code *)0x11c22f;
    iterator_uncommited_seeks();
LAB_0011c22f:
    pcStack_28c0 = (code *)0x11c236;
    iterator_uncommited_seeks();
LAB_0011c236:
    pcStack_28c0 = (code *)0x11c23d;
    iterator_uncommited_seeks();
LAB_0011c23d:
    pcStack_28c0 = (code *)0x11c245;
    iterator_uncommited_seeks();
LAB_0011c245:
    pcStack_28c0 = (code *)0x11c24c;
    iterator_uncommited_seeks();
LAB_0011c24c:
    pcStack_28c0 = (code *)0x11c253;
    iterator_uncommited_seeks();
LAB_0011c253:
    pcStack_28c0 = (code *)0x11c25b;
    iterator_uncommited_seeks();
LAB_0011c25b:
    pcStack_28c0 = (code *)0x11c262;
    iterator_uncommited_seeks();
LAB_0011c262:
    pcStack_28c0 = (code *)0x11c269;
    iterator_uncommited_seeks();
  }
  pcStack_28c0 = iterator_init_using_substring_test;
  iterator_uncommited_seeks();
  pfStack_2c68 = (fdb_config *)0x11c28b;
  pfStack_28d0 = pfVar7;
  ppfStack_28c8 = (fdb_iterator **)&uStack_2720;
  pcStack_28c0 = (code *)uVar10;
  gettimeofday(&tStack_2be0,(__timezone_ptr_t)0x0);
  pfStack_2c68 = (fdb_config *)0x11c290;
  memleak_start();
  pfVar7 = &fStack_2ac8;
  pfStack_2c68 = (fdb_config *)0x11c2a0;
  fdb_get_default_config();
  fStack_2ac8.buffercache_size = 0;
  pfStack_2c68 = (fdb_config *)0x11c2b2;
  fdb_get_default_kvs_config();
  pfStack_2c68 = (fdb_config *)0x11c2d2;
  sprintf(acStack_29d0,"rm -rf  %s*","./iterator_test");
  pfStack_2c68 = (fdb_config *)0x11c2da;
  system(acStack_29d0);
  pfStack_2c68 = (fdb_config *)0x11c2ee;
  fVar2 = fdb_open(&pfStack_2c40,"./iterator_test1",pfVar7);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_2c68 = (fdb_config *)0x11c30c;
    fVar2 = fdb_kvs_open(pfStack_2c40,&pfStack_2c48,(char *)0x0,&fStack_2bf8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c4a6;
    uStack_2c08 = 0x34323634353773;
    uStack_2c01 = 0xff;
    uStack_2c20 = 0x34323634353773;
    uStack_2c19 = 0x10000ff;
    uStack_2c10._0_4_ = 0x34353773;
    uStack_2c10._4_1_ = true;
    uStack_2c10._5_1_ = true;
    uStack_2c10._6_1_ = '4';
    uStack_2c10._7_1_ = 0xff;
    uStack_2c30 = 0xff34323634353773;
    uStack_2c28 = 0xff;
    uStack_2bd0 = 0x3179656b;
    uStack_2bcc = 0;
    pfStack_2c68 = (fdb_config *)0x11c370;
    fVar2 = fdb_set_kv(pfStack_2c48,&uStack_2c08,0xb,&uStack_2bd0,4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c4ab;
    uStack_2bcc = 0;
    uStack_2bd0 = 0x3279656b;
    pfStack_2c68 = (fdb_config *)0x11c3a4;
    fVar2 = fdb_set_kv(pfStack_2c48,&uStack_2c20,0xb,&uStack_2bd0,4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c4b0;
    pfStack_2c68 = (fdb_config *)0x11c3bb;
    fVar2 = fdb_commit(pfStack_2c40,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c4b5;
    pfStack_2c68 = (fdb_config *)0x11c3ee;
    fVar2 = fdb_iterator_init(pfStack_2c48,&pfStack_2c50,&uStack_2c10,8,&uStack_2c30,9,10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c4ba;
    iVar8 = 0;
    pfVar7 = (fdb_config *)&pfStack_2c38;
    do {
      pfStack_2c38 = (fdb_doc *)0x0;
      pfStack_2c68 = (fdb_config *)0x11c413;
      fVar2 = fdb_iterator_get(pfStack_2c50,(fdb_doc **)pfVar7);
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      iVar8 = iVar8 + 1;
      pfStack_2c68 = (fdb_config *)0x11c423;
      fdb_doc_free(pfStack_2c38);
      pfStack_2c68 = (fdb_config *)0x11c42d;
      fVar2 = fdb_iterator_next(pfStack_2c50);
    } while (fVar2 == FDB_RESULT_SUCCESS);
    if (iVar8 != 2) goto LAB_0011c4bf;
    pfStack_2c68 = (fdb_config *)0x11c444;
    fVar2 = fdb_iterator_close(pfStack_2c50);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c4c4;
    pfStack_2c68 = (fdb_config *)0x11c452;
    fVar2 = fdb_close(pfStack_2c40);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c4c9;
    pfStack_2c68 = (fdb_config *)0x11c45b;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_2c68 = (fdb_config *)0x11c464;
      memleak_end();
      pcVar9 = "%s PASSED\n";
      if (iterator_init_using_substring_test()::__test_pass != '\0') {
        pcVar9 = "%s FAILED\n";
      }
      pfStack_2c68 = (fdb_config *)0x11c495;
      fprintf(_stderr,pcVar9,"iterator init using substring test");
      return;
    }
  }
  else {
    pfStack_2c68 = (fdb_config *)0x11c4a6;
    iterator_init_using_substring_test();
LAB_0011c4a6:
    pfStack_2c68 = (fdb_config *)0x11c4ab;
    iterator_init_using_substring_test();
LAB_0011c4ab:
    pfStack_2c68 = (fdb_config *)0x11c4b0;
    iterator_init_using_substring_test();
LAB_0011c4b0:
    pfStack_2c68 = (fdb_config *)0x11c4b5;
    iterator_init_using_substring_test();
LAB_0011c4b5:
    pfStack_2c68 = (fdb_config *)0x11c4ba;
    iterator_init_using_substring_test();
LAB_0011c4ba:
    pfStack_2c68 = (fdb_config *)0x11c4bf;
    iterator_init_using_substring_test();
LAB_0011c4bf:
    pfStack_2c68 = (fdb_config *)0x11c4c4;
    iterator_init_using_substring_test();
LAB_0011c4c4:
    pfStack_2c68 = (fdb_config *)0x11c4c9;
    iterator_init_using_substring_test();
LAB_0011c4c9:
    pfStack_2c68 = (fdb_config *)0x11c4ce;
    iterator_init_using_substring_test();
  }
  pfStack_2c68 = (fdb_config *)iterator_seek_to_max_key_with_deletes_test;
  iterator_init_using_substring_test();
  pfStack_2dc0 = (fdb_config *)0x11c4e9;
  pfStack_2c68 = pfVar7;
  gettimeofday(&tStack_2d70,(__timezone_ptr_t)0x0);
  pfStack_2dc0 = (fdb_config *)0x11c4ee;
  memleak_start();
  pfStack_2da8 = (fdb_iterator *)0x0;
  pfStack_2d98 = (fdb_doc *)0x0;
  pfVar7 = &fStack_2d60;
  pfStack_2dc0 = (fdb_config *)0x11c505;
  fdb_get_default_config();
  pfStack_2dc0 = (fdb_config *)0x11c50f;
  fdb_get_default_kvs_config();
  pfStack_2dc0 = (fdb_config *)0x11c51b;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfStack_2dc0 = (fdb_config *)0x11c52f;
  fVar2 = fdb_open(&pfStack_2d90,"./iterator_test1",pfVar7);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_2dc0 = (fdb_config *)0x11c54b;
    fVar2 = fdb_kvs_open_default(pfStack_2d90,&pfStack_2da0,&fStack_2d88);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c708;
    pfStack_2dc0 = (fdb_config *)0x11c56e;
    fdb_set_kv(pfStack_2da0,"A",1,(void *)0x0,0);
    pfVar7 = (fdb_config *)0x154dcc;
    pfStack_2dc0 = (fdb_config *)0x11c58c;
    fdb_set_kv(pfStack_2da0,"B",1,(void *)0x0,0);
    pfStack_2dc0 = (fdb_config *)0x11c5b7;
    fVar2 = fdb_iterator_init(pfStack_2da0,&pfStack_2da8,"B",1,"Bzz",3,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c70f;
    pfStack_2dc0 = (fdb_config *)0x11c5c9;
    fVar2 = fdb_iterator_seek_to_max(pfStack_2da8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c714;
    pfStack_2dc0 = (fdb_config *)0x11c5e0;
    fVar2 = fdb_iterator_get(pfStack_2da8,&pfStack_2d98);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c71b;
    if (*pfStack_2d98->key != 'B') goto LAB_0011c722;
    pfStack_2dc0 = (fdb_config *)0x11c5ff;
    fdb_doc_free(pfStack_2d98);
    pfStack_2d98 = (fdb_doc *)0x0;
    pfStack_2dc0 = (fdb_config *)0x11c612;
    fVar2 = fdb_iterator_close(pfStack_2da8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c72a;
    pfStack_2da8 = (fdb_iterator *)0x0;
    pfStack_2dc0 = (fdb_config *)0x11c639;
    fVar2 = fdb_del_kv(pfStack_2da0,"B",1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c731;
    pfStack_2dc0 = (fdb_config *)0x11c670;
    fVar2 = fdb_iterator_init(pfStack_2da0,&pfStack_2da8,"B",1,"Bzz",3,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c738;
    pfStack_2dc0 = (fdb_config *)0x11c687;
    fVar2 = fdb_iterator_get(pfStack_2da8,&pfStack_2d98);
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c73d;
    pfStack_2dc0 = (fdb_config *)0x11c69a;
    fVar2 = fdb_iterator_seek_to_max(pfStack_2da8);
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c742;
    pfStack_2dc0 = (fdb_config *)0x11c6ad;
    fVar2 = fdb_close(pfStack_2d90);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c747;
    pfStack_2dc0 = (fdb_config *)0x11c6ba;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_2dc0 = (fdb_config *)0x11c6c7;
      memleak_end();
      pcVar9 = "%s PASSED\n";
      if (iterator_seek_to_max_key_with_deletes_test()::__test_pass != '\0') {
        pcVar9 = "%s FAILED\n";
      }
      pfStack_2dc0 = (fdb_config *)0x11c6f8;
      fprintf(_stderr,pcVar9,"iterator seek to max test");
      return;
    }
  }
  else {
    pfStack_2dc0 = (fdb_config *)0x11c708;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c708:
    pfStack_2dc0 = (fdb_config *)0x11c70f;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c70f:
    pfStack_2dc0 = (fdb_config *)0x11c714;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c714:
    pfStack_2dc0 = (fdb_config *)0x11c71b;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c71b:
    pfStack_2dc0 = (fdb_config *)0x11c722;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c722:
    pfStack_2dc0 = (fdb_config *)0x11c72a;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c72a:
    pfStack_2dc0 = (fdb_config *)0x11c731;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c731:
    pfStack_2dc0 = (fdb_config *)0x11c738;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c738:
    pfStack_2dc0 = (fdb_config *)0x11c73d;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c73d:
    pfStack_2dc0 = (fdb_config *)0x11c742;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c742:
    pfStack_2dc0 = (fdb_config *)0x11c747;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c747:
    pfStack_2dc0 = (fdb_config *)0x11c74e;
    iterator_seek_to_max_key_with_deletes_test();
  }
  pfStack_2dc0 = (fdb_config *)iterator_seek_to_min_key_with_deletes_test;
  iterator_seek_to_max_key_with_deletes_test();
  pfStack_2dc0 = pfVar7;
  gettimeofday(&tStack_2ec8,(__timezone_ptr_t)0x0);
  memleak_start();
  pfStack_2f00 = (fdb_iterator *)0x0;
  pfStack_2ee8 = (fdb_doc *)0x0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fVar2 = fdb_open(&pfStack_2ef0,"./iterator_test1",&fStack_2eb8);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_kvs_open_default(pfStack_2ef0,&pfStack_2ef8,&fStack_2ee0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c8f5;
    fdb_set_kv(pfStack_2ef8,"B",1,(void *)0x0,0);
    fdb_set_kv(pfStack_2ef8,"C",1,(void *)0x0,0);
    fVar2 = fdb_del_kv(pfStack_2ef8,"B",1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c8fc;
    fVar2 = fdb_iterator_init(pfStack_2ef8,&pfStack_2f00,"A",1,"B",1,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c903;
    fVar2 = fdb_iterator_get(pfStack_2f00,&pfStack_2ee8);
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c908;
    fVar2 = fdb_iterator_seek_to_min(pfStack_2f00);
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c90d;
    fVar2 = fdb_iterator_close(pfStack_2f00);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c912;
    fVar2 = fdb_close(pfStack_2ef0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_shutdown();
      if (fVar2 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar9 = "%s PASSED\n";
        if (iterator_seek_to_min_key_with_deletes_test()::__test_pass != '\0') {
          pcVar9 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar9,"iterator seek to min test");
        return;
      }
      goto LAB_0011c920;
    }
  }
  else {
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c8f5:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c8fc:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c903:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c908:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c90d:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c912:
    iterator_seek_to_min_key_with_deletes_test();
  }
  iterator_seek_to_min_key_with_deletes_test();
LAB_0011c920:
  iterator_seek_to_min_key_with_deletes_test();
  iterator_test();
  iterator_with_concurrent_updates_test();
  iterator_compact_uncommitted_db();
  iterator_seek_test();
  iVar8 = 0;
  do {
    iterator_complete_test(iVar8,0);
    iterator_complete_test(iVar8,1);
    iVar8 = iVar8 + 1;
  } while (iVar8 != 7);
  iterator_extreme_key_test();
  iterator_inmem_snapshot_seek_test(false);
  iterator_inmem_snapshot_seek_test(true);
  iterator_no_deletes_test();
  iterator_set_del_docs_test();
  iterator_del_next_test();
  sequence_iterator_test();
  sequence_iterator_duplicate_test();
  sequence_iterator_range_test();
  reverse_seek_to_max_nokey();
  reverse_sequence_iterator_test();
  reverse_sequence_iterator_kvs_test();
  reverse_iterator_test();
  iterator_seek_wal_only_test();
  iterator_after_wal_threshold();
  iterator_manual_wal_flush();
  sequence_iterator_seek_test(true);
  sequence_iterator_seek_test(false);
  iterator_concurrent_compaction();
  iterator_offset_access_test();
  iterator_deleted_doc_right_before_the_end_test();
  iterator_uncommited_seeks();
  iterator_init_using_substring_test();
  iterator_seek_to_max_key_with_deletes_test();
  iterator_seek_to_min_key_with_deletes_test();
  return;
}

Assistant:

void iterator_offset_access_test()
{
    TEST_INIT();
    memleak_start();


    int i, r;
    int n = 1000;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *o_db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status s;
    fdb_iterator *it;

    // remove  all previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 512;
    fconfig.buffercache_size = 4096;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    fconfig.purging_interval = 1; // retain deletes until compaction

    // open db
    s = fdb_open(&dbfile, "./iterator_test1", &fconfig);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &db, "DB", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &o_db,"ODB", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // set docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            NULL, 0, (void*)bodybuf, strlen(bodybuf));
        s = fdb_set(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        // set in offset verification index
        s = fdb_set_kv(o_db, keybuf, strlen(keybuf),
                        &doc[i]->offset, sizeof(uint64_t));
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    // delete some
     for (i=n/4;i<n/2;++i){
        sprintf(keybuf, "key%d", i);
        s = fdb_del_kv(db, (void*)keybuf, strlen(keybuf));
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    // update initial n/4 docs
    for (i=0;i<n/4;++i){
        sprintf(keybuf, "k0y%d", i);
        sprintf(bodybuf, "b0dy%d", i);
        fdb_doc_free(doc[i]);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            NULL, 0, (void*)bodybuf, strlen(bodybuf));
        s = fdb_set(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // create iterator with no deletes
    fdb_iterator_init(o_db, &it, NULL, 0, NULL, 0, FDB_ITR_NO_DELETES);

    // only 2nd half of docs should exist at original offset
    for (i=n/2;i<n;i+=10){

        // get by offset
        s = fdb_get_byoffset(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        // seek to in verificaiton db
        s = fdb_iterator_seek(it, doc[i]->key, doc[i]->keylen, 0);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_iterator_get(it, &rdoc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CHK(*((uint64_t *)rdoc->body) == doc[i]->offset);

        // delete
        s = fdb_del(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        // track new offset storing in doc[i]
        fdb_get_metaonly(db, doc[i]);
    }

    fdb_iterator_close(it);
    s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // do some sets passed recorded offset
    for (i=0;i<n/4;++i){
        sprintf(keybuf, "k1y%d", i);
        sprintf(bodybuf, "b1dy%d", i);
        s = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    // known offsets exist between n/2 - n
    for (i=n/2;i<n;i+=10){

        // verify can get by offset from main db
        s = fdb_get_byoffset(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_KEY_NOT_FOUND);

        // should be deleted now at new offset
        TEST_CHK(doc[i]->deleted == true);
    }

    for(i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    fdb_doc_free(rdoc);
    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("iterator offset access test");
}